

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

BOOL TryEnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  bool bVar1;
  CPalThread *pThread_00;
  bool fRet;
  CPalThread *pThread;
  LPCRITICAL_SECTION lpCriticalSection_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  bVar1 = CorUnix::InternalTryEnterCriticalSection(pThread_00,lpCriticalSection);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (BOOL)bVar1;
}

Assistant:

BOOL TryEnterCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(TryEnterCriticalSection);
    ENTRY("TryEnterCriticalSection(lpCriticalSection=%p)\n", lpCriticalSection);

    CPalThread * pThread = InternalGetCurrentThread();

    bool fRet = InternalTryEnterCriticalSection(pThread,
        lpCriticalSection);

    LOGEXIT("TryEnterCriticalSection returns bool %d\n", (int)fRet);
    PERF_EXIT(TryEnterCriticalSection);

    return (BOOL)fRet;
}